

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numsys.cpp
# Opt level: O0

StringEnumeration * icu_63::NumberingSystem::getAvailableNames(UErrorCode *status)

{
  UBool UVar1;
  UVector *pUVar2;
  UResourceBundle *pUVar3;
  NumsysNameEnumeration *this;
  size_t in_RSI;
  bool bVar4;
  NumsysNameEnumeration *local_108;
  UResourceBundle *local_d8;
  UVector *local_90;
  LocalPointerBase<icu_63::UnicodeString> local_68;
  LocalPointer<icu_63::UnicodeString> newElem;
  char *nsName;
  LocalUResourceBundlePointer nsCurrent;
  UResourceBundle *numberingSystemsInfo;
  int local_40;
  UErrorCode rbstatus;
  undefined1 local_29;
  UVector *local_28;
  LocalPointerBase<icu_63::UVector> local_20;
  LocalPointer<icu_63::UVector> numsysNames;
  UErrorCode *status_local;
  
  numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr =
       (LocalPointerBase<icu_63::UVector>)(LocalPointerBase<icu_63::UVector>)status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (getAvailableNames::availableNames == (StringEnumeration *)0x0) {
      pUVar2 = (UVector *)UMemory::operator_new((UMemory *)0x28,in_RSI);
      local_29 = 0;
      local_90 = (UVector *)0x0;
      if (pUVar2 != (UVector *)0x0) {
        local_29 = 1;
        local_28 = pUVar2;
        UVector::UVector(pUVar2,uprv_deleteUObject_63,(UElementsAreEqual *)0x0,
                         (UErrorCode *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
        local_90 = pUVar2;
      }
      LocalPointer<icu_63::UVector>::LocalPointer
                ((LocalPointer<icu_63::UVector> *)&local_20,local_90,
                 (UErrorCode *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
      UVar1 = ::U_FAILURE(*(UErrorCode *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
      if (UVar1 == '\0') {
        numberingSystemsInfo._4_4_ = U_ZERO_ERROR;
        nsCurrent.super_LocalPointerBase<UResourceBundle>.ptr =
             (LocalPointerBase<UResourceBundle>)
             ures_openDirect_63((char *)0x0,"numberingSystems",
                                (UErrorCode *)((long)&numberingSystemsInfo + 4));
        local_d8 = (UResourceBundle *)0x4e081c;
        nsCurrent.super_LocalPointerBase<UResourceBundle>.ptr =
             (LocalPointerBase<UResourceBundle>)
             ures_getByKey_63((UResourceBundle *)
                              nsCurrent.super_LocalPointerBase<UResourceBundle>.ptr,
                              "numberingSystems",
                              (UResourceBundle *)
                              nsCurrent.super_LocalPointerBase<UResourceBundle>.ptr,
                              (UErrorCode *)((long)&numberingSystemsInfo + 4));
        UVar1 = ::U_FAILURE(numberingSystemsInfo._4_4_);
        if (UVar1 == '\0') {
          do {
            UVar1 = ures_hasNext_63((UResourceBundle *)
                                    nsCurrent.super_LocalPointerBase<UResourceBundle>.ptr);
            bVar4 = false;
            if (UVar1 != '\0') {
              UVar1 = ::U_SUCCESS(*(UErrorCode *)
                                   numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
              bVar4 = UVar1 != '\0';
            }
            if (!bVar4) break;
            local_d8 = ures_getNextResource_63
                                 ((UResourceBundle *)
                                  nsCurrent.super_LocalPointerBase<UResourceBundle>.ptr,
                                  (UResourceBundle *)0x0,
                                  (UErrorCode *)((long)&numberingSystemsInfo + 4));
            LocalUResourceBundlePointer::LocalUResourceBundlePointer
                      ((LocalUResourceBundlePointer *)&nsName,local_d8);
            if (numberingSystemsInfo._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
              *(undefined4 *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr = 7;
              local_40 = 3;
            }
            else {
              pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                                 ((LocalPointerBase<UResourceBundle> *)&nsName);
              newElem.super_LocalPointerBase<icu_63::UnicodeString>.ptr =
                   (LocalPointerBase<icu_63::UnicodeString>)ures_getKey_63(pUVar3);
              pUVar3 = (UResourceBundle *)UMemory::operator_new((UMemory *)0x40,(size_t)local_d8);
              local_d8 = (UResourceBundle *)0x0;
              if (pUVar3 != (UResourceBundle *)0x0) {
                icu_63::UnicodeString::UnicodeString
                          ((UnicodeString *)pUVar3,
                           (char *)newElem.super_LocalPointerBase<icu_63::UnicodeString>.ptr,-1,
                           kInvariant);
                local_d8 = pUVar3;
              }
              LocalPointer<icu_63::UnicodeString>::LocalPointer
                        ((LocalPointer<icu_63::UnicodeString> *)&local_68,(UnicodeString *)local_d8,
                         (UErrorCode *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
              UVar1 = ::U_SUCCESS(*(UErrorCode *)
                                   numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
              if (UVar1 != '\0') {
                pUVar2 = LocalPointerBase<icu_63::UVector>::operator->(&local_20);
                local_d8 = (UResourceBundle *)
                           LocalPointerBase<icu_63::UnicodeString>::getAlias(&local_68);
                UVector::addElement(pUVar2,local_d8,
                                    (UErrorCode *)
                                    numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
                UVar1 = ::U_SUCCESS(*(UErrorCode *)
                                     numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
                if (UVar1 != '\0') {
                  LocalPointerBase<icu_63::UnicodeString>::orphan(&local_68);
                }
              }
              LocalPointer<icu_63::UnicodeString>::~LocalPointer
                        ((LocalPointer<icu_63::UnicodeString> *)&local_68);
              local_40 = 0;
            }
            LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                      ((LocalUResourceBundlePointer *)&nsName);
          } while (local_40 == 0);
          ures_close_63((UResourceBundle *)nsCurrent.super_LocalPointerBase<UResourceBundle>.ptr);
          UVar1 = ::U_FAILURE(*(UErrorCode *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr
                             );
          if (UVar1 == '\0') {
            this = (NumsysNameEnumeration *)UMemory::operator_new((UMemory *)0x80,(size_t)local_d8);
            local_108 = (NumsysNameEnumeration *)0x0;
            if (this != (NumsysNameEnumeration *)0x0) {
              pUVar2 = LocalPointerBase<icu_63::UVector>::getAlias(&local_20);
              NumsysNameEnumeration::NumsysNameEnumeration
                        (this,pUVar2,
                         (UErrorCode *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr);
              local_108 = this;
            }
            getAvailableNames::availableNames = &local_108->super_StringEnumeration;
            if (local_108 == (NumsysNameEnumeration *)0x0) {
              *(undefined4 *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr = 7;
              status_local = (UErrorCode *)0x0;
              local_40 = 1;
            }
            else {
              LocalPointerBase<icu_63::UVector>::orphan(&local_20);
              local_40 = 0;
            }
          }
          else {
            status_local = (UErrorCode *)0x0;
            local_40 = 1;
          }
        }
        else {
          if (numberingSystemsInfo._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
            *(undefined4 *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr = 7;
          }
          else {
            *(undefined4 *)numsysNames.super_LocalPointerBase<icu_63::UVector>.ptr = 2;
          }
          ures_close_63((UResourceBundle *)nsCurrent.super_LocalPointerBase<UResourceBundle>.ptr);
          status_local = (UErrorCode *)0x0;
          local_40 = 1;
        }
      }
      else {
        status_local = (UErrorCode *)0x0;
        local_40 = 1;
      }
      LocalPointer<icu_63::UVector>::~LocalPointer((LocalPointer<icu_63::UVector> *)&local_20);
      if (local_40 != 0) {
        return (StringEnumeration *)status_local;
      }
    }
    status_local = (UErrorCode *)getAvailableNames::availableNames;
  }
  else {
    status_local = (UErrorCode *)0x0;
  }
  return (StringEnumeration *)status_local;
}

Assistant:

StringEnumeration* NumberingSystem::getAvailableNames(UErrorCode &status) {
    // TODO(ticket #11908): Init-once static cache, with u_cleanup() callback.
    static StringEnumeration* availableNames = nullptr;

    if (U_FAILURE(status)) {
        return nullptr;
    }

    if ( availableNames == nullptr ) {
        // TODO: Simple array of UnicodeString objects, based on length of table resource?
        LocalPointer<UVector> numsysNames(new UVector(uprv_deleteUObject, nullptr, status), status);
        if (U_FAILURE(status)) {
            return nullptr;
        }
        
        UErrorCode rbstatus = U_ZERO_ERROR;
        UResourceBundle *numberingSystemsInfo = ures_openDirect(nullptr, "numberingSystems", &rbstatus);
        numberingSystemsInfo = ures_getByKey(numberingSystemsInfo, "numberingSystems", numberingSystemsInfo, &rbstatus);
        if (U_FAILURE(rbstatus)) {
            // Don't stomp on the catastrophic failure of OOM.
            if (rbstatus == U_MEMORY_ALLOCATION_ERROR) {
                status = rbstatus;
            } else {
                status = U_MISSING_RESOURCE_ERROR;
            }
            ures_close(numberingSystemsInfo);
            return nullptr;
        }

        while ( ures_hasNext(numberingSystemsInfo) && U_SUCCESS(status) ) {
            LocalUResourceBundlePointer nsCurrent(ures_getNextResource(numberingSystemsInfo, nullptr, &rbstatus));
            if (rbstatus == U_MEMORY_ALLOCATION_ERROR) {
                status = rbstatus; // we want to report OOM failure back to the caller.
                break;
            }
            const char *nsName = ures_getKey(nsCurrent.getAlias());
            LocalPointer<UnicodeString> newElem(new UnicodeString(nsName, -1, US_INV), status);
            if (U_SUCCESS(status)) {
                numsysNames->addElement(newElem.getAlias(), status);
                if (U_SUCCESS(status)) {
                    newElem.orphan(); // on success, the numsysNames vector owns newElem.
                }
            }
        }

        ures_close(numberingSystemsInfo);
        if (U_FAILURE(status)) {
            return nullptr;
        }
        availableNames = new NumsysNameEnumeration(numsysNames.getAlias(), status);
        if (availableNames == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return nullptr;
        }
        numsysNames.orphan();  // The names got adopted.
    }

    return availableNames;
}